

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsStrash.c
# Opt level: O3

Hop_Obj_t * Abc_MfsConvertAigToHop(Aig_Man_t *pMan,Hop_Man_t *pHop)

{
  void *pvVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  Hop_Obj_t *pHVar4;
  ulong uVar5;
  Hop_Obj_t **ppHVar6;
  long lVar7;
  
  if (pMan->nObjs[3] != 1) {
    __assert_fail("Aig_ManCoNum(pMan) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/mfs/mfsStrash.c"
                  ,0x47,"Hop_Obj_t *Abc_MfsConvertAigToHop(Aig_Man_t *, Hop_Man_t *)");
  }
  if (0 < pMan->vCos->nSize) {
    pvVar1 = *pMan->vCos->pArray;
    uVar5 = *(ulong *)((long)pvVar1 + 8);
    if ((*(uint *)((uVar5 & 0xfffffffffffffffe) + 0x18) & 7) == 1) {
      ppHVar6 = &pHop->pConst1;
    }
    else {
      Aig_ManCleanData(pMan);
      pVVar3 = pMan->vCis;
      if (0 < pVVar3->nSize) {
        lVar7 = 0;
        do {
          pvVar2 = pVVar3->pArray[lVar7];
          pHVar4 = Hop_IthVar(pHop,(int)lVar7);
          *(Hop_Obj_t **)((long)pvVar2 + 0x28) = pHVar4;
          lVar7 = lVar7 + 1;
          pVVar3 = pMan->vCis;
        } while (lVar7 < pVVar3->nSize);
      }
      Abc_MfsConvertAigToHop_rec
                ((Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe),pHop);
      uVar5 = *(ulong *)((long)pvVar1 + 8);
      ppHVar6 = (Hop_Obj_t **)((uVar5 & 0xfffffffffffffffe) + 0x28);
    }
    return (Hop_Obj_t *)((ulong)((uint)uVar5 & 1) ^ (ulong)*ppHVar6);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Hop_Obj_t * Abc_MfsConvertAigToHop( Aig_Man_t * pMan, Hop_Man_t * pHop )
{
    Aig_Obj_t * pRoot, * pObj;
    int i;
    assert( Aig_ManCoNum(pMan) == 1 );
    pRoot = Aig_ManCo( pMan, 0 );
    // check the case of a constant
    if ( Aig_ObjIsConst1( Aig_ObjFanin0(pRoot) ) )
        return Hop_NotCond( Hop_ManConst1(pHop), Aig_ObjFaninC0(pRoot) );
    // set the PI mapping
    Aig_ManCleanData( pMan );
    Aig_ManForEachCi( pMan, pObj, i )
        pObj->pData = Hop_IthVar( pHop, i );
    // construct the AIG
    Abc_MfsConvertAigToHop_rec( Aig_ObjFanin0(pRoot), pHop );
    return Hop_NotCond( (Hop_Obj_t *)Aig_ObjFanin0(pRoot)->pData, Aig_ObjFaninC0(pRoot) );
}